

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<1280>,unsigned_long>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<1280> *k,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  unsigned_long h;
  value_type_conflict3 local_38;
  
  while (start < 0x500) {
    flipbit(k,0xa0,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0xa0,0,&local_38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(hashes,&local_38);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<1280>,unsigned_long>
                (hash,start + 1U,bitsleft + -1,inclusive,k,hashes);
    }
    flipbit(k,0xa0,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}